

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::Attribute::get_value<std::vector<double,std::allocator<double>>>
          (Attribute *this,vector<double,_std::allocator<double>_> *v)

{
  value_type *__x;
  optional<std::vector<double,_std::allocator<double>_>_> local_60;
  undefined1 local_40 [8];
  optional<std::vector<double,_std::allocator<double>_>_> ret;
  vector<double,_std::allocator<double>_> *v_local;
  Attribute *this_local;
  
  if (v == (vector<double,_std::allocator<double>_> *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    ret.contained._16_8_ = v;
    primvar::PrimVar::get_value<std::vector<double,std::allocator<double>>>(&local_60,&this->_var);
    nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::
    optional<std::vector<double,_std::allocator<double>_>,_0>
              ((optional<std::vector<double,_std::allocator<double>_>_> *)local_40,&local_60);
    nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
              (&local_60);
    this_local._7_1_ = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_40);
    if (this_local._7_1_) {
      __x = nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::value
                      ((optional<std::vector<double,_std::allocator<double>_>_> *)local_40);
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)ret.contained._16_8_,__x);
    }
    nonstd::optional_lite::optional<std::vector<double,_std::allocator<double>_>_>::~optional
              ((optional<std::vector<double,_std::allocator<double>_>_> *)local_40);
  }
  return this_local._7_1_;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }